

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.hpp
# Opt level: O1

string * __thiscall
duckdb::CSVRejectsTable::GetObjectType_abi_cxx11_
          (string *__return_storage_ptr__,CSVRejectsTable *this)

{
  char *pcVar1;
  size_type __dnew;
  size_type local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_18 = 0x17;
  pcVar1 = (char *)::std::__cxx11::string::_M_create
                             ((ulong *)__return_storage_ptr__,(ulong)&local_18);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
  builtin_strncpy(pcVar1,"csv_rejects_table_cache",0x17);
  __return_storage_ptr__->_M_string_length = local_18;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_18] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string GetObjectType() override {
		return ObjectType();
	}